

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweight_test.hpp
# Opt level: O3

void __thiscall
trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
          (detail *this,char *expr1,char *expr2,char *predicate_text,char *file,int line,
          char *function,double *lhs,double *rhs,close_to<double> predicate)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  undefined4 in_register_0000008c;
  double dVar4;
  double dVar5;
  
  dVar4 = ABS(*(double *)function);
  dVar5 = ABS(*lhs);
  if (dVar5 <= dVar4) {
    dVar5 = dVar4;
  }
  dVar5 = dVar5 * predicate.relative;
  dVar4 = predicate.absolute;
  if (predicate.absolute <= dVar5) {
    dVar4 = dVar5;
  }
  if (ABS(*(double *)function - *lhs) < dVar4) {
    test_success();
    return;
  }
  __s = (char *)CONCAT44(in_register_0000008c,line);
  if (predicate_text == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1110c0);
  }
  else {
    sVar2 = strlen(predicate_text);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,predicate_text,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)file);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): test \'",9);
  iVar1 = (int)poVar3;
  if (this == (detail *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)this,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," == ",4);
  if (expr1 == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(expr1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,expr1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' failed in function \'",0x16);
  if (__s == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\': ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
  poVar3 = std::ostream::_M_insert<double>(*(double *)function);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' != \'",6);
  poVar3 = std::ostream::_M_insert<double>(*lhs);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' (",3);
  if (expr2 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(expr2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,expr2,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  test_failure();
  return;
}

Assistant:

inline void test_with_impl(char const * expr1,
                           char const * expr2,
                           char const * predicate_text,
                           char const * file, int line, char const * function,
                           const T& lhs, const T& rhs, BinaryPredicate<T> predicate)
{
    if (predicate(lhs, rhs))
    {
        test_success();
    }
    else
    {
        BOOST_LIGHTWEIGHT_TEST_OSTREAM
            << file << "(" << line << "): test '" << expr1 << " == " << expr2
            << "' failed in function '" << function << "': "
            << "'" << lhs << "' != '" << rhs << "' (" << predicate_text << ")" << std::endl;
        test_failure();
    }
}